

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_storage.cpp
# Opt level: O3

void __thiscall
duckdb::StdOutLogStorage::WriteLogEntry
          (StdOutLogStorage *this,timestamp_t timestamp,LogLevel level,string *log_type,
          string *log_message,RegisteredLoggingContext *context)

{
  pointer pcVar1;
  bool bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_7;
  char cVar3;
  char *pcVar4;
  idx_t iVar5;
  idx_t iVar6;
  char cVar7;
  undefined8 in_stack_fffffffffffffe48;
  char *__first;
  uint in_stack_fffffffffffffe58;
  undefined1 in_stack_fffffffffffffe5c [20];
  char *__first_00;
  uint in_stack_fffffffffffffe78;
  undefined1 in_stack_fffffffffffffe7c [20];
  uint in_stack_fffffffffffffe98;
  undefined1 in_stack_fffffffffffffe9c [20];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  undefined1 *local_110 [2];
  undefined1 local_100 [16];
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  Value local_70;
  
  local_110[0] = local_100;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_110,"[LOG] %s, %s, %s, %s, %s, %s, %s, %s\n","");
  Value::TIMESTAMP(&local_70,timestamp);
  Value::ToString_abi_cxx11_(&local_b0,&local_70);
  pcVar1 = (log_type->_M_dataplus)._M_p;
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_130,pcVar1,pcVar1 + log_type->_M_string_length);
  pcVar4 = EnumUtil::ToChars<duckdb::LogLevel>(level);
  ::std::__cxx11::string::string((string *)&local_d0,pcVar4,(allocator *)&stack0xfffffffffffffe4f);
  pcVar1 = (log_message->_M_dataplus)._M_p;
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_150,pcVar1,pcVar1 + log_message->_M_string_length);
  pcVar4 = EnumUtil::ToChars<duckdb::LogContextScope>((context->context).scope);
  ::std::__cxx11::string::string((string *)&local_90,pcVar4,(allocator *)&stack0xfffffffffffffe4f);
  if ((context->context).connection_id.index == 0xffffffffffffffff) {
    pcVar4 = &stack0xfffffffffffffea0;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xfffffffffffffe90,"NULL","");
  }
  else {
    iVar5 = optional_idx::GetIndex(&(context->context).connection_id);
    cVar7 = '\x01';
    if (9 < iVar5) {
      iVar6 = iVar5;
      cVar3 = '\x04';
      do {
        cVar7 = cVar3;
        if (iVar6 < 100) {
          cVar7 = cVar7 + -2;
          goto LAB_00e98c2e;
        }
        if (iVar6 < 1000) {
          cVar7 = cVar7 + -1;
          goto LAB_00e98c2e;
        }
        if (iVar6 < 10000) goto LAB_00e98c2e;
        bVar2 = 99999 < iVar6;
        iVar6 = iVar6 / 10000;
        cVar3 = cVar7 + '\x04';
      } while (bVar2);
      cVar7 = cVar7 + '\x01';
    }
LAB_00e98c2e:
    pcVar4 = &stack0xfffffffffffffea0;
    ::std::__cxx11::string::_M_construct((ulong)&stack0xfffffffffffffe90,cVar7);
    ::std::__detail::__to_chars_10_impl<unsigned_long>(pcVar4,in_stack_fffffffffffffe98,iVar5);
  }
  if ((context->context).transaction_id.index == 0xffffffffffffffff) {
    __first_00 = &stack0xfffffffffffffe80;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xfffffffffffffe70,"NULL","");
  }
  else {
    iVar5 = optional_idx::GetIndex(&(context->context).transaction_id);
    cVar7 = '\x01';
    if (9 < iVar5) {
      iVar6 = iVar5;
      cVar3 = '\x04';
      do {
        cVar7 = cVar3;
        if (iVar6 < 100) {
          cVar7 = cVar7 + -2;
          goto LAB_00e98ce6;
        }
        if (iVar6 < 1000) {
          cVar7 = cVar7 + -1;
          goto LAB_00e98ce6;
        }
        if (iVar6 < 10000) goto LAB_00e98ce6;
        bVar2 = 99999 < iVar6;
        iVar6 = iVar6 / 10000;
        cVar3 = cVar7 + '\x04';
      } while (bVar2);
      cVar7 = cVar7 + '\x01';
    }
LAB_00e98ce6:
    __first_00 = &stack0xfffffffffffffe80;
    ::std::__cxx11::string::_M_construct((ulong)&stack0xfffffffffffffe70,cVar7);
    ::std::__detail::__to_chars_10_impl<unsigned_long>(__first_00,in_stack_fffffffffffffe78,iVar5);
  }
  if ((context->context).thread_id.index == 0xffffffffffffffff) {
    __first = &stack0xfffffffffffffe60;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xfffffffffffffe50,"NULL","");
  }
  else {
    iVar5 = optional_idx::GetIndex(&(context->context).thread_id);
    cVar7 = '\x01';
    if (9 < iVar5) {
      iVar6 = iVar5;
      cVar3 = '\x04';
      do {
        cVar7 = cVar3;
        if (iVar6 < 100) {
          cVar7 = cVar7 + -2;
          goto LAB_00e98da1;
        }
        if (iVar6 < 1000) {
          cVar7 = cVar7 + -1;
          goto LAB_00e98da1;
        }
        if (iVar6 < 10000) goto LAB_00e98da1;
        bVar2 = 99999 < iVar6;
        iVar6 = iVar6 / 10000;
        cVar3 = cVar7 + '\x04';
      } while (bVar2);
      cVar7 = cVar7 + '\x01';
    }
LAB_00e98da1:
    __first = &stack0xfffffffffffffe60;
    ::std::__cxx11::string::_M_construct((ulong)&stack0xfffffffffffffe50,cVar7);
    ::std::__detail::__to_chars_10_impl<unsigned_long>(__first,in_stack_fffffffffffffe58,iVar5);
  }
  params_4._M_string_length = (size_type)&stack0xfffffffffffffe70;
  params_4._M_dataplus._M_p = &stack0xfffffffffffffe90;
  params_4.field_2._M_allocated_capacity = (size_type)&stack0xfffffffffffffe50;
  params_4.field_2._8_8_ = in_stack_fffffffffffffe48;
  params_5._M_string_length._0_4_ = in_stack_fffffffffffffe58;
  params_5._M_dataplus._M_p = __first;
  params_5._12_20_ = in_stack_fffffffffffffe5c;
  params_6._M_string_length._0_4_ = in_stack_fffffffffffffe78;
  params_6._M_dataplus._M_p = __first_00;
  params_6._12_20_ = in_stack_fffffffffffffe7c;
  params_7._M_string_length._0_4_ = in_stack_fffffffffffffe98;
  params_7._M_dataplus._M_p = pcVar4;
  params_7._12_20_ = in_stack_fffffffffffffe9c;
  StringUtil::
  Format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (&local_f0,(StringUtil *)local_110,&local_b0,&local_130,&local_d0,&local_150,&local_90,
             params_4,params_5,params_6,params_7);
  ::std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&::std::cout,local_f0._M_dataplus._M_p,local_f0._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  if (__first != &stack0xfffffffffffffe60) {
    operator_delete(__first);
  }
  if (__first_00 != &stack0xfffffffffffffe80) {
    operator_delete(__first_00);
  }
  if (pcVar4 != &stack0xfffffffffffffea0) {
    operator_delete(pcVar4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  Value::~Value(&local_70);
  if (local_110[0] != local_100) {
    operator_delete(local_110[0]);
  }
  return;
}

Assistant:

void StdOutLogStorage::WriteLogEntry(timestamp_t timestamp, LogLevel level, const string &log_type,
                                     const string &log_message, const RegisteredLoggingContext &context) {
	std::cout << StringUtil::Format(
	    "[LOG] %s, %s, %s, %s, %s, %s, %s, %s\n", Value::TIMESTAMP(timestamp).ToString(), log_type,
	    EnumUtil::ToString(level), log_message, EnumUtil::ToString(context.context.scope),
	    context.context.connection_id.IsValid() ? to_string(context.context.connection_id.GetIndex()) : "NULL",
	    context.context.transaction_id.IsValid() ? to_string(context.context.transaction_id.GetIndex()) : "NULL",
	    context.context.thread_id.IsValid() ? to_string(context.context.thread_id.GetIndex()) : "NULL");
}